

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O3

void __thiscall
capnp::DynamicStruct::Reader::Reader(Reader *this,StructSchema schema,OrphanBuilder *orphan)

{
  uint uVar1;
  ushort uVar2;
  Schema local_50;
  Reader local_48;
  
  (this->schema).super_Schema.raw = (RawBrandedSchema *)schema.super_Schema.raw;
  local_50 = schema.super_Schema.raw;
  Schema::getProto(&local_48,&local_50);
  uVar1 = 0;
  if (local_48._reader.dataSize < 0x80) {
    uVar2 = 0;
  }
  else {
    uVar2 = *(ushort *)((long)local_48._reader.data + 0xe);
    if (0xcf < local_48._reader.dataSize) {
      uVar1 = (uint)*(ushort *)((long)local_48._reader.data + 0x18) << 0x10;
    }
  }
  _::OrphanBuilder::asStructReader(&this->reader,orphan,(StructSize)(uVar2 | uVar1));
  return;
}

Assistant:

DynamicStruct::Reader::Reader(StructSchema schema, const _::OrphanBuilder& orphan)
    : schema(schema), reader(orphan.asStructReader(structSizeFromSchema(schema))) {}